

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

DallasStatus __thiscall
AmpIO::DallasReadTool(AmpIO *this,uint32_t *model,uint8_t *version,string *name,double timeoutSec)

{
  DallasStateType DVar1;
  BasePort *pBVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  __uint32_t _Var6;
  int iVar7;
  double dVar8;
  uchar local_148 [8];
  char buffer [256];
  uint32_t ctrl;
  uint32_t status;
  uint32_t ver;
  DallasStatus ret;
  double timeoutSec_local;
  string *name_local;
  uint8_t *version_local;
  uint32_t *model_local;
  AmpIO *this_local;
  
  status = 4;
  _ver = timeoutSec;
  timeoutSec_local = (double)name;
  name_local = (string *)version;
  version_local = (uint8_t *)model;
  model_local = (uint32_t *)this;
  uVar4 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar4 < 7) {
    status = 0;
  }
  else {
    uVar4 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar4 == 0x64524131) {
      pBVar2 = (this->super_FpgaIO).super_BoardIO.port;
      uVar5 = (*pBVar2->_vptr_BasePort[0x23])
                        (pBVar2,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xb012,
                         version_local);
      if ((uVar5 & 1) == 0) {
        return DALLAS_IO_ERROR;
      }
      _Var6 = __bswap_32(*(__uint32_t *)version_local);
      *(__uint32_t *)version_local = _Var6;
      pBVar2 = (this->super_FpgaIO).super_BoardIO.port;
      uVar5 = (*pBVar2->_vptr_BasePort[0x23])
                        (pBVar2,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xb013,&ctrl);
      if ((uVar5 & 1) == 0) {
        return DALLAS_IO_ERROR;
      }
      name_local->_M_dataplus = ctrl._0_1_;
      std::__cxx11::string::operator=((string *)timeoutSec_local,"");
      if (name_local->_M_dataplus != (_Alloc_hider)0xff) {
        status = 5;
      }
    }
    else {
      this->dallasTimeoutSec = _ver;
      DVar1 = this->dallasState;
      if (DVar1 == ST_DALLAS_START) {
        buffer[0xf8] = '\x02';
        buffer[0xf9] = '\0';
        buffer[0xfa] = -0x80;
        buffer[0xfb] = '\0';
        bVar3 = DallasWriteControl(this,0x800002);
        if (bVar3) {
          this->dallasState = ST_DALLAS_WAIT;
          this->dallasStateNext = ST_DALLAS_READ;
          dVar8 = Amp1394_GetTime();
          this->dallasWaitStart = dVar8;
        }
        else {
          status = 1;
        }
      }
      else if (DVar1 == ST_DALLAS_WAIT) {
        bVar3 = DallasReadStatus(this,(uint32_t *)(buffer + 0xfc));
        if (bVar3) {
          if ((buffer._252_4_ & 0x20f0) == 0) {
            this->dallasState = this->dallasStateNext;
            this->dallasUseDS2480B = (buffer._252_4_ & 0x8000) == 0x8000;
          }
          else {
            dVar8 = Amp1394_GetTime();
            if (this->dallasWaitStart + this->dallasTimeoutSec < dVar8) {
              status = 2;
            }
          }
        }
        else {
          status = 1;
        }
      }
      else if (DVar1 == ST_DALLAS_READ) {
        bVar3 = DallasReadBlock(this,local_148,0x100);
        if (bVar3) {
          iVar7 = strncmp((char *)local_148,"997",3);
          if (iVar7 == 0) {
            buffer[0x9c] = '\0';
            *(undefined4 *)version_local = buffer._28_4_;
            _Var6 = __bswap_32(*(__uint32_t *)version_local);
            *(__uint32_t *)version_local = _Var6;
            name_local->_M_dataplus = (_Alloc_hider)buffer[0x20];
            buffer[0xf4] = '\0';
            std::__cxx11::string::operator=((string *)timeoutSec_local,buffer + 0xd8);
            status = 5;
            this->dallasState = ST_DALLAS_START;
          }
          else {
            status = 3;
          }
        }
        else {
          status = 1;
        }
        if (((this->dallasUseDS2480B & 1U) != 0) && (bVar3 = DallasWriteControl(this,9), bVar3)) {
          this->dallasState = ST_DALLAS_WAIT;
          this->dallasStateNext = ST_DALLAS_START;
          dVar8 = Amp1394_GetTime();
          this->dallasWaitStart = dVar8;
        }
      }
      if (((status == 1) || (status == 2)) || (status == 3)) {
        this->dallasState = ST_DALLAS_START;
      }
    }
  }
  return status;
}

Assistant:

AmpIO::DallasStatus AmpIO::DallasReadTool(uint32_t &model, uint8_t &version, std::string &name,
                                          double timeoutSec)
{
    DallasStatus ret = DALLAS_WAIT;

    if (GetFirmwareVersion() < 7) {
        ret = DALLAS_NONE;
    }
    else if (GetHardwareVersion() == dRA1_String) {
        if (!port->ReadQuadlet(BoardId, 0xb012, model))
            return DALLAS_IO_ERROR;
        model = bswap_32(model);
        uint32_t ver;
        if (!port->ReadQuadlet(BoardId, 0xb013, ver))
            return DALLAS_IO_ERROR;
        version = ver & 0x000000ff;
        name = "";
        if (version != 255)
            ret = DALLAS_OK;
    }
    else {   // QLA or DQLA

        uint32_t status;
        uint32_t ctrl;
        char buffer[256];

        dallasTimeoutSec = timeoutSec;

        switch (dallasState) {

        case ST_DALLAS_START:
            // Start reading at address DALLAS_START_READ
            ctrl = (DALLAS_START_READ<<16)|2;
            if (DallasWriteControl(ctrl)) {
                dallasState = ST_DALLAS_WAIT;
                dallasStateNext = ST_DALLAS_READ;
                dallasWaitStart = Amp1394_GetTime();
            }
            else {
                ret = DALLAS_IO_ERROR;
            }
            break;

        case ST_DALLAS_WAIT:
            if (DallasReadStatus(status)) {
                // Done when in idle state. The following test works for both Firmware Rev 7
                // (state is bits 7:4) and Firmware Rev 8 (state is bits 8:4 and busy flag is bit 13)
                if ((status&0x000020F0) == 0) {
                    dallasState = dallasStateNext;
                    // Automatically detect interface in use
                    dallasUseDS2480B = (status & 0x00008000) == 0x00008000;
                }
                else if (Amp1394_GetTime() > dallasWaitStart + dallasTimeoutSec) {
                    ret = DALLAS_TIMEOUT;
                }
            }
            else {
                ret = DALLAS_IO_ERROR;
            }
            break;

        case ST_DALLAS_READ:
            if (DallasReadBlock(reinterpret_cast<unsigned char *>(buffer), sizeof(buffer))) {
                // make sure we read the 997 from company statement
                if (strncmp(buffer, "997", 3) == 0) {
                    // get model and name of tool to create unique string identifier
                    // model number uses only 3 bytes, set first one to zero just in case
                    buffer[DALLAS_MODEL_OFFSET] = 0;
                    model = *(reinterpret_cast<uint32_t *>(buffer + (DALLAS_MODEL_OFFSET - DALLAS_START_READ)));
                    model = bswap_32(model);
                    // version number
                    version = static_cast<uint8_t>(buffer[DALLAS_VERSION_OFFSET - DALLAS_START_READ]);
                    // name
                    buffer[DALLAS_NAME_END - DALLAS_START_READ] = '\0';
                    name = buffer + (DALLAS_NAME_OFFSET - DALLAS_START_READ);
                    ret = DALLAS_OK;
                    dallasState = ST_DALLAS_START;  // Nominal; could be updated below for DS2480B
                }
                else {
                    ret = DALLAS_DATA_ERROR;
                }
            }
            else {
                ret = DALLAS_IO_ERROR;
            }
            if (dallasUseDS2480B) {
                // 0x09 indicates reg_wdata[3] == 1 && reg_wdata[1:0] == 01 in firmware DS2505.v
                // If the write fails, we ignore it and return to ST_DALLAS_START, rather than
                // return DALLAS_IO_ERROR, because this is after the read.
                if (DallasWriteControl(0x09)){
                    dallasState = ST_DALLAS_WAIT;
                    dallasStateNext = ST_DALLAS_START;
                    dallasWaitStart = Amp1394_GetTime();
                }
            }
            break;
        }

        if ((ret == DALLAS_IO_ERROR) || (ret == DALLAS_TIMEOUT) || (ret == DALLAS_DATA_ERROR)) {
            dallasState = ST_DALLAS_START;
        }
    }

    return ret;
}